

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttbdf.c
# Opt level: O0

void tt_face_free_bdf_props(TT_Face face)

{
  FT_Stream stream;
  TT_BDF bdf;
  TT_Face face_local;
  
  if ((face->bdf).loaded != '\0') {
    if ((face->bdf).table != (FT_Byte *)0x0) {
      FT_Stream_ReleaseFrame((face->root).stream,&(face->bdf).table);
    }
    (face->bdf).table_end = (FT_Byte *)0x0;
    (face->bdf).strings = (FT_Byte *)0x0;
    (face->bdf).strings_size = 0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_bdf_props( TT_Face  face )
  {
    TT_BDF  bdf = &face->bdf;


    if ( bdf->loaded )
    {
      FT_Stream  stream = FT_FACE( face )->stream;


      if ( bdf->table )
        FT_FRAME_RELEASE( bdf->table );

      bdf->table_end    = NULL;
      bdf->strings      = NULL;
      bdf->strings_size = 0;
    }
  }